

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

Map * new_map(uint size)

{
  uint number;
  uint uVar1;
  Map *pMVar2;
  void **ppvVar3;
  
  pMVar2 = (Map *)malloc(0x18);
  pMVar2->size = 0;
  number = 0xb;
  if (size != 0) {
    number = size;
  }
  pMVar2->capacity = number;
  ppvVar3 = (void **)malloc((ulong)number * 0x18);
  pMVar2->elem = ppvVar3;
  uVar1 = get_max_prime(number);
  pMVar2->prime = uVar1;
  return pMVar2;
}

Assistant:

Map *new_map(unsigned int size) {
    Map *map = malloc(sizeof(Map));
    map->size = 0;
    map->capacity = size ? size : 11;
    map->elem = malloc(sizeof(List) * map->capacity);
    map->prime = get_max_prime(map->capacity);
    return map;
}